

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UniValue * __thiscall
DescribeAddressVisitor::operator()(DescribeAddressVisitor *this,WitnessUnknown *id)

{
  Span<const_unsigned_char> s;
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *other;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  UniValue *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc8;
  Span<const_unsigned_char> *this_00;
  undefined4 in_stack_fffffffffffffdd0;
  VType in_stack_fffffffffffffdd4;
  UniValue *in_stack_fffffffffffffdd8;
  UniValue *val;
  UniValue *this_01;
  UniValue *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe4c;
  undefined1 uVar2;
  allocator<char> in_stack_fffffffffffffe4f;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (UniValue *)&stack0xffffffffffffffd8;
  val = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  UniValue::UniValue(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,(allocator<char> *)this_01)
  ;
  uVar2 = 1;
  UniValue::UniValue<bool,_bool,_true>(this_01,(bool *)val);
  UniValue::pushKV(in_stack_fffffffffffffe00,(string *)this_01,val);
  UniValue::~UniValue(in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,(allocator<char> *)this_01)
  ;
  uVar1 = WitnessUnknown::GetWitnessVersion((WitnessUnknown *)in_stack_fffffffffffffdb8);
  UniValue::UniValue<unsigned_int,_unsigned_int,_true>(this_01,&val->typ);
  UniValue::pushKV(in_stack_fffffffffffffe00,(string *)this_01,val);
  UniValue::~UniValue(in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe4d);
  this_00 = (Span<const_unsigned_char> *)&stack0xfffffffffffffe47;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,(allocator<char> *)this_01)
  ;
  other = WitnessUnknown::GetWitnessProgram((WitnessUnknown *)in_stack_fffffffffffffdb8);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this_00,other,in_stack_fffffffffffffdb8);
  s.m_size._0_4_ = uVar1;
  s.m_data = (uchar *)in_stack_fffffffffffffe40;
  s.m_size._4_2_ = in_stack_fffffffffffffe4c;
  s.m_size._6_1_ = uVar2;
  s.m_size._7_1_ = in_stack_fffffffffffffe4f;
  HexStr_abi_cxx11_(s);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(in_stack_fffffffffffffe00,(string *)this_01,val);
  UniValue::~UniValue(in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue operator()(const WitnessUnknown& id) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("iswitness", true);
        obj.pushKV("witness_version", id.GetWitnessVersion());
        obj.pushKV("witness_program", HexStr(id.GetWitnessProgram()));
        return obj;
    }